

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith.hpp
# Opt level: O0

size_t interp_decompress(uint32_t *obuff,size_t osize,uint8_t *ibuff,size_t isize)

{
  value_type vVar1;
  ulong uVar2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar3;
  size_t sVar4;
  unsigned_long *v_00;
  reference pvVar5;
  long in_RCX;
  long in_RDX;
  ulong in_RSI;
  long in_RDI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> T;
  size_t ip;
  uint64_t v;
  uint64_t vr;
  uint64_t vl;
  uint64_t vp;
  int p;
  int i;
  allocator_type *in_stack_ffffffffffffff60;
  size_type in_stack_ffffffffffffff68;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_68;
  size_t local_50;
  uint64_t local_48;
  value_type local_40;
  ulong local_38;
  uint64_t local_30;
  int local_28;
  int local_24;
  long local_20;
  long local_18;
  ulong local_10;
  long local_8;
  
  local_50 = 0;
  pvVar3 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RSI * 2 + -1);
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x1777c1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (pvVar3,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x1777e1);
  pvVar3 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(local_18 + local_50);
  sVar4 = local_20 - local_50;
  v_00 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                   ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x17780f);
  sVar4 = byte_decode((uint8_t *)pvVar3,sVar4,0x8000000000000000,v_00);
  local_50 = sVar4 + local_50;
  for (local_28 = 0; (ulong)(long)local_28 < local_10 - 1; local_28 = local_28 + 1) {
    pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&local_68,(long)local_28);
    local_30 = *pvVar5;
    sVar4 = byte_decode((uint8_t *)(local_18 + local_50),local_20 - local_50,local_30,&local_48);
    local_50 = sVar4 + local_50;
    if ((local_48 + local_30 & 1) == 0) {
      local_38 = (local_30 - local_48 >> 1) + 1;
    }
    else {
      local_38 = local_30 + local_48 + 1 >> 1;
    }
    uVar2 = local_38;
    local_40 = (local_30 - local_38) + 1;
    pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&local_68,(long)(local_28 * 2 + 1));
    vVar1 = local_40;
    *pvVar5 = uVar2;
    pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&local_68,(long)(local_28 * 2 + 2));
    *pvVar5 = vVar1;
  }
  for (local_24 = 0; sVar4 = local_50, (ulong)(long)local_24 < local_10; local_24 = local_24 + 1) {
    pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&local_68,((long)local_24 + local_10) - 1);
    *(int *)(local_8 + (long)local_24 * 4) = (int)*pvVar5;
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(pvVar3);
  return sVar4;
}

Assistant:

size_t interp_decompress(uint32_t* obuff, /* output buffer */
    size_t osize, /* number symbols to be decoded */
    const uint8_t* ibuff, /* input buffer */
    size_t isize)
{ /* size of input buffer */
    int i, p;
    uint64_t vp, vl, vr, v;
    size_t ip = 0;

    std::vector<uint64_t> T(2 * osize - 1);
    ip += byte_decode(ibuff + ip, isize - ip, (1LL << 63), T.data());
    for (p = 0; p < osize - 1; p++) {
        vp = T[p];
        ip += byte_decode(ibuff + ip, isize - ip, vp, &v);
        if (((v + vp) & 1) == 0) {
            vl = 1 + ((vp - v) >> 1);
        } else {
            vl = (vp + v + 1) >> 1;
        }
        vr = vp - vl + 1;
        T[2 * p + 1] = vl;
        T[2 * p + 2] = vr;
    }
    for (i = 0; i < osize; i++) {
        obuff[i] = T[i + osize - 1];
    }
    return ip;
}